

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::StartTesting(XmlReporter *this)

{
  byte bVar1;
  ostream *os;
  IConfig *pIVar2;
  undefined1 local_c0 [47];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [63];
  allocator local_31;
  string local_30 [32];
  XmlReporter *local_10;
  XmlReporter *this_local;
  
  local_10 = this;
  os = ReporterConfig::stream(&this->m_config);
  XmlWriter::setStream(&this->m_xml,os);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Catch",&local_31);
  XmlWriter::startElement(&this->m_xml,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ReporterConfig::fullConfig((ReporterConfig *)local_70);
  pIVar2 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)local_70);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_70 + 8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)(local_70 + 8));
  Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)local_70);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"name",&local_91);
    ReporterConfig::fullConfig((ReporterConfig *)local_c0);
    pIVar2 = Ptr<Catch::IConfig>::operator->((Ptr<Catch::IConfig> *)local_c0);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_c0 + 8);
    XmlWriter::writeAttribute(&this->m_xml,(string *)local_90,(string *)(local_c0 + 8));
    std::__cxx11::string::~string((string *)(local_c0 + 8));
    Ptr<Catch::IConfig>::~Ptr((Ptr<Catch::IConfig> *)local_c0);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return;
}

Assistant:

virtual void StartTesting() {
            m_xml.setStream( m_config.stream() );
            m_xml.startElement( "Catch" );
            if( !m_config.fullConfig()->name().empty() )
                m_xml.writeAttribute( "name", m_config.fullConfig()->name() );
        }